

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

bool __thiscall
PDA::containsEndState
          (PDA *this,vector<EvaluationState,_std::allocator<EvaluationState>_> *evaluations)

{
  bool bVar1;
  reference pEVar2;
  undefined1 local_90 [8];
  EvaluationState state;
  iterator __end1;
  iterator __begin1;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *__range1;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *evaluations_local;
  PDA *this_local;
  
  __end1 = std::vector<EvaluationState,_std::allocator<EvaluationState>_>::begin(evaluations);
  state.currentStates =
       (State *)std::vector<EvaluationState,_std::allocator<EvaluationState>_>::end(evaluations);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
                                     *)&state.currentStates), bVar1) {
    pEVar2 = __gnu_cxx::
             __normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
             ::operator*(&__end1);
    EvaluationState::EvaluationState((EvaluationState *)local_90,pEVar2);
    bVar1 = isEndState(this,(State *)state.stack.c.
                                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    EvaluationState::~EvaluationState((EvaluationState *)local_90);
    if (bVar1) goto LAB_00115026;
    __gnu_cxx::
    __normal_iterator<EvaluationState_*,_std::vector<EvaluationState,_std::allocator<EvaluationState>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 0;
LAB_00115026:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PDA::containsEndState(std::vector<EvaluationState> evaluations) {
    for (EvaluationState state: evaluations) {
        if (isEndState(state.currentStates)) {
            return true;
        }
    }
    return false;
}